

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptravltree.h
# Opt level: O0

int __thiscall cookmem::PtrAVLTree::remove(PtrAVLTree *this,char *__filename)

{
  short sVar1;
  Node *apNStack_40238 [32767];
  Node *next;
  Node *pNStack_238;
  int16_t depth;
  Node *stack [65];
  Node *local_28;
  Node *root;
  size_t *size_local;
  PtrAVLTree *this_local;
  
  if (this->m_root == (Node *)0x0) {
    this_local = (PtrAVLTree *)0x0;
    goto LAB_0010638c;
  }
  local_28 = this->m_root;
  pNStack_238 = local_28;
  next._6_2_ = 0;
  while (local_28 != (Node *)0x0) {
    if (*(ulong *)__filename < local_28->size) {
      local_28 = local_28->left;
      stack[(long)(next._6_2_ + 1) + -1] = local_28;
    }
    else {
      sVar1 = next._6_2_;
      if (*(ulong *)__filename <= local_28->size) goto LAB_0010630b;
      local_28 = local_28->right;
      stack[(long)(next._6_2_ + 1) + -1] = local_28;
    }
    next._6_2_ = next._6_2_ + 1;
  }
  sVar1 = next._6_2_ + -1;
  local_28 = stack[(long)sVar1 + -1];
  if (local_28->size < *(ulong *)__filename) {
    if (sVar1 == 0) {
      this_local = (PtrAVLTree *)0x0;
      goto LAB_0010638c;
    }
    local_28 = stack[(long)(short)(next._6_2_ + -2) + -1];
    sVar1 = next._6_2_ + -2;
    if (local_28->size < *(ulong *)__filename) {
      this_local = (PtrAVLTree *)0x0;
      goto LAB_0010638c;
    }
  }
LAB_0010630b:
  next._6_2_ = sVar1;
  if (local_28->next == (Node *)0x0) {
    removeNode(this,local_28,&stack0xfffffffffffffdc8,(int)next._6_2_);
    *(size_t *)__filename = local_28->size;
    this_local = (PtrAVLTree *)local_28;
  }
  else {
    this_local = (PtrAVLTree *)local_28->next;
    local_28->next = ((Node *)this_local)->next;
    *(size_t *)__filename = ((Node *)this_local)->size;
  }
LAB_0010638c:
  return (int)this_local;
}

Assistant:

void*
    remove (std::size_t& size)
    {
        Node* root;
        Node* stack[sizeof(Node*) * 8 + 1];
        std::int16_t depth;

        if (m_root == nullptr)
        {
            return nullptr;
        }

        root = stack[0] = m_root;

        for (depth = 0; ; ++depth)
        {
            if (root == nullptr)
            {
                --depth;
                root = stack[depth];
                if (size > root->size)
                {
                    // check if the parent is also smaller.
                    if (depth == 0)
                    {
                        return nullptr;
                    }

                    --depth;
                    root = stack[depth];
                    if (size > root->size)
                    {
                        return nullptr;
                    }
                    break;
                }
                break;
            }

            if (size < root->size)
            {
                root = stack[depth + 1] = root->left;
                continue;
            }
            else if (size > root->size)
            {
                root = stack[depth + 1] = root->right;
                continue;
            }

            break;
        }

        // At this point, this node's size is the smallest size
        // larger than or equal to rs.size.
        if (root->next)
        {
            // This is a simple case of having SLL of similar sized nodes.
            // just remove one from the SLL.
            Node* next = root->next;
            root->next = next->next;

            size = next->size;
            return next;
        }

        removeNode (root, stack, depth);
        size = root->size;
        return root;
    }